

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree-dense-points.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  SaveBlock save;
  LoadBlock load_;
  pointer piVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  vector<PointT,_std::allocator<PointT>_> *this_00;
  RegularLink<diy::Bounds<float>_> *this_01;
  pointer piVar5;
  int iVar6;
  undefined4 uStack_1b04;
  undefined7 uStack_1af8;
  bool help;
  undefined8 in_stack_ffffffffffffe510;
  _Head_base<0UL,_opts::BasicOption_*,_false> in_stack_ffffffffffffe518;
  _Head_base<0UL,_opts::BasicOption_*,_false> _Var7;
  _Head_base<0UL,_opts::BasicOption_*,_false> in_stack_ffffffffffffe520;
  _Head_base<0UL,_opts::BasicOption_*,_false> _Var8;
  _Head_base<0UL,_opts::BasicOption_*,_false> in_stack_ffffffffffffe528;
  _Head_base<0UL,_opts::BasicOption_*,_false> _Var9;
  _Head_base<0UL,_opts::BasicOption_*,_false> in_stack_ffffffffffffe530;
  _Head_base<0UL,_opts::BasicOption_*,_false> q_policy;
  int bins;
  int nblocks;
  environment env;
  vector<int,_std::allocator<int>_> gids;
  communicator comm;
  ContiguousAssigner cuts_assigner;
  vector<PointT,_std::allocator<PointT>_> points;
  communicator local_1a40;
  _Any_data local_1a28;
  code *local_1a18;
  code *local_1a10;
  _Any_data local_1a08;
  code *local_19f8;
  code *local_19f0;
  _Vector_base<PointT,_std::allocator<PointT>_> local_19e0;
  _Any_data local_19c8;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  _Any_data local_19a8;
  undefined8 local_1998;
  undefined8 uStack_1990;
  string local_1980;
  string local_1960;
  string local_1940;
  Options ops;
  ContinuousBounds gdomain;
  char filename [512];
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&comm);
  nblocks = 1;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  bins = 0x80;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"blocks",(allocator<char> *)&stack0xffffffffffffe517);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gdomain,"number of blocks",(allocator<char> *)&stack0xffffffffffffe516);
  opts::Option<int>((opts *)&stack0xffffffffffffe530,'b',(string *)&master,&nblocks,
                    (string *)&gdomain);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &stack0xffffffffffffe530);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&points,"filename",(allocator<char> *)&stack0xffffffffffffe515);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gids,"csv of points",(allocator<char> *)&stack0xffffffffffffe514);
  opts::Option<char[512]>
            ((opts *)&stack0xffffffffffffe528,'f',(string *)&points,&filename,(string *)&gids);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &stack0xffffffffffffe528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cuts_assigner,"bins",(allocator<char> *)&stack0xffffffffffffe513);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1940,"number of bins",(allocator<char> *)&stack0xffffffffffffe512);
  opts::Option<int>((opts *)&stack0xffffffffffffe520,'n',(string *)&cuts_assigner,&bins,&local_1940)
  ;
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &stack0xffffffffffffe520);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1960,"help",(allocator<char> *)&stack0xffffffffffffe511);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1980,"show help",(allocator<char> *)&stack0xffffffffffffe510);
  opts::Option<bool>((opts *)&stack0xffffffffffffe518,'h',&local_1960,&help,&local_1980);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &stack0xffffffffffffe518);
  if ((__uniq_ptr_impl<opts::BasicOption,_std::default_delete<opts::BasicOption>_>)
      in_stack_ffffffffffffe518._M_head_impl !=
      (__uniq_ptr_impl<opts::BasicOption,_std::default_delete<opts::BasicOption>_>)0x0) {
    (**(code **)(*(long *)in_stack_ffffffffffffe518._M_head_impl + 8))();
  }
  _Var7._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_1980);
  std::__cxx11::string::~string((string *)&local_1960);
  if ((_Head_base<0UL,_opts::BasicOption_*,_false>)in_stack_ffffffffffffe520._M_head_impl !=
      (_Head_base<0UL,_opts::BasicOption_*,_false>)0x0) {
    (*(in_stack_ffffffffffffe520._M_head_impl)->_vptr_BasicOption[1])();
  }
  _Var8._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_1940);
  std::__cxx11::string::~string((string *)&cuts_assigner);
  if ((__uniq_ptr_impl<opts::BasicOption,_std::default_delete<opts::BasicOption>_>)
      in_stack_ffffffffffffe528._M_head_impl !=
      (__uniq_ptr_impl<opts::BasicOption,_std::default_delete<opts::BasicOption>_>)0x0) {
    (**(code **)(*(long *)in_stack_ffffffffffffe528._M_head_impl + 8))();
  }
  _Var9._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&gids);
  std::__cxx11::string::~string((string *)&points);
  if ((_Head_base<0UL,_opts::BasicOption_*,_false>)in_stack_ffffffffffffe530._M_head_impl !=
      (_Head_base<0UL,_opts::BasicOption_*,_false>)0x0) {
    (*(in_stack_ffffffffffffe530._M_head_impl)->_vptr_BasicOption[1])();
  }
  q_policy._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&gdomain);
  std::__cxx11::string::~string((string *)&master);
  bVar2 = opts::Options::parse(&ops,argc,argv);
  if ((bVar2) && (help != true)) {
    local_1a40.comm_.data = comm.comm_.data;
    local_1a40.owner_ = false;
    local_1a08._M_unused._M_object = (void *)0x0;
    local_1a08._8_8_ = 0;
    local_19f0 = std::
                 _Function_handler<void_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/kd-tree-dense-points.cpp:123:35)>
                 ::_M_invoke;
    local_19f8 = std::
                 _Function_handler<void_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/kd-tree-dense-points.cpp:123:35)>
                 ::_M_manager;
    local_1a28._M_unused._M_object = (void *)0x0;
    local_1a28._8_8_ = 0;
    local_1a10 = std::
                 _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/kd-tree-dense-points.cpp:124:5)>
                 ::_M_invoke;
    local_1a18 = std::
                 _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/kd-tree-dense-points.cpp:124:5)>
                 ::_M_manager;
    local_19a8._M_unused._M_object = (void *)0x0;
    local_19a8._8_8_ = 0;
    local_1998 = 0;
    uStack_1990 = 0;
    local_19c8._M_unused._M_object = (void *)0x0;
    local_19c8._8_8_ = 0;
    local_19b8 = 0;
    uStack_19b0 = 0;
    puVar4 = (undefined8 *)operator_new(0x10);
    *puVar4 = &PTR_unload_incoming_0014f270;
    puVar4[1] = 0x1000;
    uStack_1b04 = (undefined4)((ulong)&local_19c8 >> 0x20);
    save.super__Function_base._M_functor._8_4_ = (int)&local_19c8;
    save.super__Function_base._M_functor._M_unused._M_object = &local_19a8;
    save.super__Function_base._M_functor._12_4_ = uStack_1b04;
    save.super__Function_base._M_manager = (_Manager_type)puVar4;
    save._M_invoker._0_7_ = uStack_1af8;
    save._M_invoker._7_1_ = help;
    load_.super__Function_base._M_functor._8_8_ = _Var7._M_head_impl;
    load_.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffe510;
    load_.super__Function_base._M_manager = (_Manager_type)_Var8._M_head_impl;
    load_._M_invoker = (_Invoker_type)_Var9._M_head_impl;
    diy::Master::Master(&master,&local_1a40,1,-1,(CreateBlock *)&local_1a08,
                        (DestroyBlock *)&local_1a28,(ExternalStorage *)0x0,save,load_,
                        (QueuePolicy *)q_policy._M_head_impl);
    std::_Function_base::~_Function_base((_Function_base *)&local_19c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_19a8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1a28);
    std::_Function_base::~_Function_base((_Function_base *)&local_1a08);
    diy::mpi::communicator::~communicator(&local_1a40);
    cuts_assigner.super_StaticAssigner.super_Assigner.size_ = comm.size_;
    cuts_assigner.super_StaticAssigner.super_Assigner.nblocks_ = nblocks;
    cuts_assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_0014f3f0;
    read_csv(&points,filename);
    std::vector<PointT,_std::allocator<PointT>_>::vector
              ((vector<PointT,_std::allocator<PointT>_> *)&local_19e0,&points);
    compute_bounds(&gdomain,(vector<PointT,_std::allocator<PointT>_> *)&local_19e0);
    std::_Vector_base<PointT,_std::allocator<PointT>_>::~_Vector_base(&local_19e0);
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    diy::ContiguousAssigner::local_gids(&cuts_assigner,comm.rank_,&gids);
    piVar1 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar5 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
      iVar6 = *piVar5;
      this_00 = (vector<PointT,_std::allocator<PointT>_> *)operator_new(0x18);
      (this_00->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      (this_00->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      (this_00->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      if (iVar6 == *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        std::vector<PointT,_std::allocator<PointT>_>::operator=(this_00,&points);
      }
      this_01 = (RegularLink<diy::Bounds<float>_> *)operator_new(0x1b8);
      diy::RegularLink<diy::Bounds<float>_>::RegularLink(this_01,3,&gdomain,&gdomain);
      diy::Master::add(&master,iVar6,this_00,(Link *)this_01);
    }
    iVar6 = 0;
    diy::kdtree<BlockT,PointT>(&master,(Assigner *)&cuts_assigner,3,&gdomain,0,(long)bins,false);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&gids.super__Vector_base<int,_std::allocator<int>_>);
    diy::Bounds<float>::~Bounds(&gdomain);
    std::_Vector_base<PointT,_std::allocator<PointT>_>::~_Vector_base
              (&points.super__Vector_base<PointT,_std::allocator<PointT>_>);
    diy::Master::~Master(&master);
  }
  else {
    iVar6 = 1;
    if (comm.rank_ == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar3 = std::operator<<(poVar3,*argv);
      std::operator<<(poVar3," [OPTIONS]\n");
      std::operator<<((ostream *)&std::cout,
                      "Tests Kd tree with dataset where most points are located very closely.\n");
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  opts::Options::~Options(&ops);
  diy::mpi::communicator::~communicator(&comm);
  diy::mpi::environment::~environment(&env);
  return iVar6;
}

Assistant:

int main (int argc, char* argv[])
{
  diy::mpi::environment env(argc, argv);
  diy::mpi::communicator comm;

  bool help;
  int nblocks = 1;
  int bins = 128;
  char filename[512];

  // get command line arguments
  using namespace opts;
  Options ops;
  ops
    >> Option('b', "blocks",    nblocks,        "number of blocks")
    >> Option('f', "filename",  filename,       "csv of points")
    >> Option('n', "bins",      bins,           "number of bins")
    >> Option('h', "help",      help,           "show help")
    ;

  if (!ops.parse(argc,argv) || help)
  {
    if (comm.rank() == 0)
    {
      std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
      std::cout << "Tests Kd tree with dataset where most points are located very closely.\n";
      std::cout << ops;
    }
    return 1;
  }

  diy::Master master(comm, 1, -1, []() { return static_cast<void*>(new BlockT); },
    [](void* b) { delete static_cast<BlockT*>(b); });

  diy::ContiguousAssigner cuts_assigner(comm.size(), nblocks);

  auto points = read_csv(filename);

  const auto gdomain = compute_bounds(points);

  std::vector<int> gids;
  cuts_assigner.local_gids(comm.rank(), gids);
  for (const int gid : gids)
  {
    auto block = new BlockT();
    if (gid == gids[0])
    {
      block->AddPoints(std::move(points));
    }
    auto link = new diy::RegularContinuousLink(3, gdomain, gdomain);
    master.add(gid, block, link);
  }

  diy::kdtree(master, cuts_assigner, 3, gdomain, &BlockT::Points, bins);

  return 0;
}